

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall
cli::Parser::CmdBase::CmdBase
          (CmdBase *this,string *name,string *alternative,string *description,bool required)

{
  pointer pcVar1;
  allocator_type local_39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_CmdBase = (_func_int **)&PTR__CmdBase_00125820;
  local_38 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  if (name->_M_string_length == 0) {
    (this->command)._M_dataplus._M_p = (pointer)&(this->command).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->command,"");
  }
  else {
    std::operator+(&this->command,"-",name);
  }
  if (alternative->_M_string_length == 0) {
    (this->alternative)._M_dataplus._M_p = (pointer)&(this->alternative).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->alternative,"");
  }
  else {
    std::operator+(&this->alternative,"--",alternative);
  }
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + description->_M_string_length);
  this->required = required;
  this->handled = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->arguments,
           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )ZEXT816(0),&local_39);
  return;
}

Assistant:

explicit CmdBase(const std::string& name, const std::string& alternative, const std::string& description, bool required) : 
				name(name),
				command(name.size() > 0 ? "-" + name : ""),
				alternative(alternative.size() > 0 ? "--" + alternative : ""),
				description(description),
				required(required),
				handled(false),
				arguments({}) {
			}